

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

ssize_t __thiscall MT32Emu::MemoryRegion::write(MemoryRegion *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  Bit32u BVar2;
  Bit8u *pBVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint in_R8D;
  byte in_R9B;
  uint uVar9;
  
  BVar2 = this->entrySize;
  uVar9 = this->entries * BVar2;
  uVar7 = (uint)__buf;
  uVar6 = (ulong)(uVar9 - 1);
  if (uVar7 <= uVar9 - 1) {
    uVar5 = (ulong)(uVar9 - uVar7);
    if (in_R8D + uVar7 <= uVar9) {
      uVar5 = (ulong)in_R8D;
    }
    pBVar3 = this->realMemory;
    uVar6 = uVar5;
    if ((pBVar3 != (Bit8u *)0x0) && ((int)uVar5 != 0)) {
      uVar8 = 0;
      do {
        uVar1 = (BVar2 * __fd + uVar7) + uVar8;
        if (this->maxTable == (Bit8u *)0x0) {
          uVar6 = CONCAT71((int7)(uVar6 >> 8),0xff);
        }
        else {
          uVar6 = uVar1 & 0xffffffff;
          uVar6 = CONCAT71((int7)(uVar6 / this->entrySize >> 8),
                           this->maxTable[uVar6 % (ulong)this->entrySize]);
        }
        bVar4 = (byte)uVar6;
        if ((bVar4 == 0 & (in_R9B ^ 1)) == 0) {
          if (*(byte *)(__n + uVar8) < bVar4) {
            bVar4 = *(byte *)(__n + uVar8);
          }
          uVar6 = uVar1 & 0xffffffff;
          pBVar3[uVar6] = bVar4;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar5);
    }
  }
  return uVar6;
}

Assistant:

void MemoryRegion::write(unsigned int entry, unsigned int off, const Bit8u *src, unsigned int len, bool init) const {
	unsigned int memOff = entry * entrySize + off;
	// This method should never be called with out-of-bounds parameters,
	// or on an unsupported region - seeing any of this debug output indicates a bug in the emulator
	if (off > entrySize * entries - 1) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters start out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	if (off + len > entrySize * entries) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters end out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		len = entrySize * entries - off;
	}
	Bit8u *dest = getRealMemory();
	if (dest == NULL) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: unwritable region: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}

	for (unsigned int i = 0; i < len; i++) {
		Bit8u desiredValue = src[i];
		Bit8u maxValue = getMaxValue(memOff);
		// maxValue == 0 means write-protected unless called from initialisation code, in which case it really means the maximum value is 0.
		if (maxValue != 0 || init) {
			if (desiredValue > maxValue) {
#if MT32EMU_MONITOR_SYSEX > 0
				synth->printDebug("write[%d]: Wanted 0x%02x at %d, but max 0x%02x", type, desiredValue, memOff, maxValue);
#endif
				desiredValue = maxValue;
			}
			dest[memOff] = desiredValue;
		} else if (desiredValue != 0) {
#if MT32EMU_MONITOR_SYSEX > 0
			// Only output debug info if they wanted to write non-zero, since a lot of things cause this to spit out a lot of debug info otherwise.
			synth->printDebug("write[%d]: Wanted 0x%02x at %d, but write-protected", type, desiredValue, memOff);
#endif
		}
		memOff++;
	}
}